

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_conf_alpn_protocols(mbedtls_ssl_config *conf,char **protos)

{
  size_t sVar1;
  char *__s;
  ulong uVar2;
  char **ppcVar3;
  
  __s = *protos;
  if (__s != (char *)0x0) {
    ppcVar3 = protos + 1;
    uVar2 = 0;
    do {
      sVar1 = strlen(__s);
      if (sVar1 - 0x100 < 0xffffffffffffff01) {
        return -0x7100;
      }
      uVar2 = uVar2 + sVar1;
      if (0xffff < uVar2) {
        return -0x7100;
      }
      __s = *ppcVar3;
      ppcVar3 = ppcVar3 + 1;
    } while (__s != (char *)0x0);
  }
  conf->alpn_list = protos;
  return 0;
}

Assistant:

int mbedtls_ssl_conf_alpn_protocols( mbedtls_ssl_config *conf, const char **protos )
{
    size_t cur_len, tot_len;
    const char **p;

    /*
     * "Empty strings MUST NOT be included and byte strings MUST NOT be
     * truncated". Check lengths now rather than later.
     */
    tot_len = 0;
    for( p = protos; *p != NULL; p++ )
    {
        cur_len = strlen( *p );
        tot_len += cur_len;

        if( cur_len == 0 || cur_len > 255 || tot_len > 65535 )
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    conf->alpn_list = protos;

    return( 0 );
}